

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateKVD(ValidationContext *this)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  pointer __result;
  pointer pKVar4;
  ulong uVar5;
  iterator iVar6;
  _Tp_alloc_type *__alloc;
  less<void> *plVar7;
  code *pcVar8;
  char *extraout_RDX_00;
  char *pcVar9;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *poVar10;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_02;
  uint uVar11;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __i;
  __buckets_ptr pp_Var12;
  pointer pKVar13;
  long lVar14;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __last;
  pointer __rhs;
  ktx_uint8_t *pkVar15;
  IssueError *__args_2;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  KeyValueEntry *entry;
  _Head_base<0UL,_unsigned_char_*,_false> bufferEnd;
  pointer pKVar19;
  _Head_base<0UL,_unsigned_char_*,_false> ptr;
  string_view prefix;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_00;
  string_view prefix_00;
  string_view prefix_01;
  string_view text;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_01;
  optional<unsigned_long> oVar20;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar21;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_02;
  string_view string;
  string_view string_00;
  string_view string_01;
  uint32_t sizeKeyValuePair;
  optional<unsigned_long> invalidIndex;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> entries;
  int local_d4;
  uint32_t sizeValue;
  ktx_uint32_t kvdByteLength;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  kvValidators;
  __array buffer;
  uchar *ptrValue;
  long remainingKVDBytes;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_70;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keys;
  char *extraout_RDX;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_01;
  
  uVar5 = (ulong)(this->header).keyValueData.byteOffset;
  kvdByteLength = (this->header).keyValueData.byteLength;
  if (kvdByteLength != 0 && uVar5 != 0) {
    uVar18 = (ulong)kvdByteLength;
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(uVar18);
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar18);
    __args_2 = (IssueError *)0x12;
    buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (*this->_vptr_ValidationContext[2])
              (this,uVar5,
               __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar18,0x12,
               "the Key/Value Data");
    bufferEnd._M_head_impl =
         (uchar *)((ulong)kvdByteLength +
                  (long)buffer._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keys._M_h._M_buckets = &keys._M_h._M_single_bucket;
    keys._M_h._M_bucket_count = 1;
    keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    keys._M_h._M_element_count = 0;
    keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    keys._M_h._M_rehash_policy._M_next_resize = 0;
    keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_70._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_d4 = 0;
    ptr._M_head_impl =
         (uchar *)buffer._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    while( true ) {
      if (bufferEnd._M_head_impl <= ptr._M_head_impl) break;
      remainingKVDBytes = (long)bufferEnd._M_head_impl - (long)ptr._M_head_impl;
      if (local_d4 == 100) {
        kvValidators._M_h._M_buckets =
             (__buckets_ptr)CONCAT44(kvValidators._M_h._M_buckets._4_4_,100);
        warning<unsigned_int,long_const&>
                  (this,&Metadata::TooManyEntries,(uint *)&kvValidators,&remainingKVDBytes);
        ptr._M_head_impl = bufferEnd._M_head_impl;
        goto LAB_001898d3;
      }
      if (remainingKVDBytes < 6) {
        error<long_const&>(this,&Metadata::NotEnoughDataForAnEntry,&remainingKVDBytes);
        ptr._M_head_impl = bufferEnd._M_head_impl;
        goto LAB_001898d3;
      }
      sizeKeyValuePair = *(uint32_t *)ptr._M_head_impl;
      uVar5 = (ulong)sizeKeyValuePair;
      if (uVar5 < 2) {
        error<unsigned_int&>(this,&Metadata::KeyAndValueByteLengthTooSmall,&sizeKeyValuePair);
      }
      else {
        puVar1 = (uint *)((long)ptr._M_head_impl + 4);
        pp_Var12 = (__buckets_ptr)(ulong)sizeKeyValuePair;
        if (bufferEnd._M_head_impl < (long)puVar1 + uVar5) {
          kvValidators._M_h._M_buckets = (__buckets_ptr)(bufferEnd._M_head_impl + -(long)puVar1);
          error<unsigned_int&,long_const&>
                    (this,&Metadata::KeyAndValueByteLengthTooLarge,&sizeKeyValuePair,
                     (long *)&kvValidators);
          sizeKeyValuePair = (uint32_t)kvValidators._M_h._M_buckets;
          uVar5 = (ulong)kvValidators._M_h._M_buckets & 0xffffffff;
          pp_Var12 = kvValidators._M_h._M_buckets;
        }
        for (uVar18 = 0; uVar11 = (uint)pp_Var12, uVar5 != uVar18; uVar18 = uVar18 + 1) {
          if (*(char *)((long)puVar1 + uVar18) == '\0') goto LAB_001895fd;
        }
        uVar18 = (ulong)pp_Var12 & 0xffffffff;
LAB_001895fd:
        uVar17 = (uint)uVar18;
        if (uVar17 == 0) {
          error<>(this,&Metadata::KeyEmpty);
        }
        else {
          sizeValue = ~uVar17 + uVar11;
          string._M_len = (__buckets_ptr)(uVar18 & 0xffffffff);
          ptrValue = (uchar *)((long)ptr._M_head_impl + 5 + (long)string._M_len);
          if (uVar17 == uVar11) {
            sizeValue = 0;
          }
          prefix._M_str = anon_var_dwarf_6f2559;
          prefix._M_len = 3;
          string._M_str = (char *)puVar1;
          kvValidators._M_h._M_buckets = string._M_len;
          kvValidators._M_h._M_bucket_count = (size_type)puVar1;
          bVar3 = starts_with(string,prefix);
          pcVar9 = extraout_RDX;
          if (bVar3) {
            kvValidators._M_h._M_bucket_count = kvValidators._M_h._M_bucket_count + 3;
            kvValidators._M_h._M_buckets = (__buckets_ptr)((long)kvValidators._M_h._M_buckets + -3);
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (this,&Metadata::KeyForbiddenBOM,
                       (basic_string_view<char,_std::char_traits<char>_> *)&kvValidators);
            pcVar9 = extraout_RDX_00;
          }
          text._M_str = pcVar9;
          text._M_len = kvValidators._M_h._M_bucket_count;
          oVar20 = validateUTF8((ktx *)kvValidators._M_h._M_buckets,text);
          invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value =
               oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged =
               oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          if (((undefined1  [16])
               oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            error<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&>
                      (this,&Metadata::KeyInvalidUTF8,
                       (basic_string_view<char,_std::char_traits<char>_> *)&kvValidators,
                       (unsigned_long *)&invalidIndex);
          }
          if (uVar17 == uVar11) {
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (this,&Metadata::KeyMissingNullTerminator,
                       (basic_string_view<char,_std::char_traits<char>_> *)&kvValidators);
          }
          pKVar19 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pKVar13 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            if ((long)entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar18 = ((long)entries.
                            super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30;
            uVar5 = uVar18;
            if (entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar5 = 1;
            }
            uVar16 = uVar5 + uVar18;
            if (0x2aaaaaaaaaaaaa9 < uVar16) {
              uVar16 = 0x2aaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar5,uVar18)) {
              uVar16 = 0x2aaaaaaaaaaaaaa;
            }
            if (uVar16 == 0) {
              __result = (pointer)0x0;
            }
            else {
              __result = (pointer)operator_new(uVar16 * 0x30);
            }
            __alloc = (_Tp_alloc_type *)&sizeValue;
            std::
            allocator_traits<std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>::
            construct<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::basic_string_view<char,std::char_traits<char>>&,unsigned_char_const*&,unsigned_int_const&>
                      ((allocator_type *)(__result + uVar18),(KeyValueEntry *)&kvValidators,
                       (basic_string_view<char,_std::char_traits<char>_> *)&ptrValue,
                       (uchar **)__alloc,(uint *)__args_2);
            pKVar4 = std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::_S_relocate
                               (pKVar13,pKVar19,__result,__alloc);
            pKVar4 = std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::_S_relocate
                               (pKVar19,pKVar19,pKVar4 + 1,__alloc);
            std::_Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>::_M_deallocate
                      ((_Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_> *)pKVar13,
                       (pointer)(((long)entries.
                                        super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pKVar13) / 0x30),
                       ((long)entries.
                              super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pKVar13) %
                       0x30);
            entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = __result + uVar16;
            entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_start = __result;
            entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_finish = pKVar4;
          }
          else {
            std::
            allocator_traits<std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>::
            construct<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::basic_string_view<char,std::char_traits<char>>&,unsigned_char_const*&,unsigned_int_const&>
                      ((allocator_type *)
                       entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(KeyValueEntry *)&kvValidators,
                       (basic_string_view<char,_std::char_traits<char>_> *)&ptrValue,
                       (uchar **)&sizeValue,(uint *)__args_2);
            entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_finish = pKVar19 + 1;
          }
          pVar21 = std::
                   _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                             ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)&keys,&kvValidators);
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (this,&Metadata::DuplicateKey,
                       (basic_string_view<char,_std::char_traits<char>_> *)&kvValidators);
          }
        }
      }
      uVar5 = (ulong)sizeKeyValuePair;
      __args_2 = &Metadata::PaddingNotZero;
      validateAlignmentPaddingZeros<char_const(&)[24]>
                (this,(void *)((long)ptr._M_head_impl + uVar5 + 4),bufferEnd._M_head_impl,4,
                 &Metadata::PaddingNotZero,(char (*) [24])"after a Key-Value entry");
      local_d4 = local_d4 + 1;
      ptr._M_head_impl = (uchar *)((long)ptr._M_head_impl + uVar5 + 7 & 0xfffffffffffffffc);
    }
    if (ptr._M_head_impl != bufferEnd._M_head_impl) {
      kvValidators._M_h._M_buckets =
           (__buckets_ptr)
           ((long)ptr._M_head_impl -
           (long)local_70._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      error<long,unsigned_int_const&>
                (this,&Metadata::SizesDontAddUp,(long *)&kvValidators,&kvdByteLength);
    }
LAB_001898d3:
    if ((this->header).supercompressionGlobalData.byteLength != 0) {
      validateAlignmentPaddingZeros<char_const(&)[25]>
                (this,ptr._M_head_impl,bufferEnd._M_head_impl,8,&Metadata::PaddingNotZero,
                 (char (*) [25])"after the last KVD entry");
    }
    pKVar19 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pKVar13 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_start;
    __rhs = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pKVar13 = __rhs + 1;
        if (pKVar13 == pKVar19) goto LAB_001899db;
        bVar3 = std::operator<(&pKVar13->key,&__rhs->key);
        __rhs = pKVar13;
      } while (!bVar3);
    }
    if (pKVar13 != pKVar19) {
      error<>(this,&Metadata::OutOfOrder);
      pKVar19 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pKVar13 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_start;
      kvValidators._M_h._M_buckets = (__buckets_ptr)0x0;
      if (entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_start !=
          entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar14 = (long)entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar5 = lVar14 / 0x30;
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        plVar7 = (less<void> *)&invalidIndex;
        __comp_02._M_comp.proj =
             (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)&kvValidators;
        __comp_02._M_comp.comp = plVar7;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp_02);
        if (lVar14 < 0x301) {
          __comp_00._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)plVar7;
          __comp_00._M_comp.comp = (less<void> *)&kvValidators;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar13,
                     (__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar19,__comp_00);
        }
        else {
          __last._M_current = pKVar13 + 0x10;
          __comp._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)plVar7;
          __comp._M_comp.comp = (less<void> *)&kvValidators;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar13,__last,__comp);
          poVar10 = extraout_RDX_01;
          for (; __last._M_current != pKVar19; __last._M_current = __last._M_current + 1) {
            __comp_01._M_comp.proj = poVar10;
            __comp_01._M_comp.comp = (less<void> *)&kvValidators;
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Val_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (__last,__comp_01);
            poVar10 = extraout_RDX_02;
          }
        }
      }
    }
LAB_001899db:
    kvValidators._M_h._M_buckets = &kvValidators._M_h._M_single_bucket;
    kvValidators._M_h._M_bucket_count = 1;
    kvValidators._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    kvValidators._M_h._M_element_count = 0;
    kvValidators._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    kvValidators._M_h._M_rehash_policy._M_next_resize = 0;
    kvValidators._M_h._M_single_bucket = (__node_base_ptr)0x0;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXcubemapIncomplete;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[21],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXcubemapIncomplete");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXorientation;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[15],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXorientation");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXglFormat;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXglFormat");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXdxgiFormat;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[16],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXdxgiFormat__");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXmetalPixelFormat;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[20],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXmetalPixelFormat");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXswizzle;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[11],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXswizzle");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXwriter;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[10],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXwriter");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXwriterScParams;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXwriterScParams");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXastcDecodeMode;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXastcDecodeMode");
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         (unsigned_long)validateKTXanimData;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&kvValidators,"KTXanimData");
    pKVar13 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pKVar19 = entries.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                   .super__Vector_impl_data._M_start; pKVar19 != pKVar13; pKVar19 = pKVar19 + 1) {
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&kvValidators._M_h,&pKVar19->key);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
          ._M_cur == (__node_type *)0x0) {
        prefix_00._M_str = "KTX";
        prefix_00._M_len = 3;
        string_00._M_str = (pKVar19->key)._M_dataplus._M_p;
        string_00._M_len = (pKVar19->key)._M_string_length;
        bVar3 = starts_with(string_00,prefix_00);
        if ((bVar3) ||
           (prefix_01._M_str = "ktx", prefix_01._M_len = 3,
           string_01._M_str = (pKVar19->key)._M_dataplus._M_p,
           string_01._M_len = (pKVar19->key)._M_string_length,
           bVar3 = starts_with(string_01,prefix_01), bVar3)) {
          error<std::__cxx11::string_const&>(this,&Metadata::UnknownReservedKey,&pKVar19->key);
        }
        else {
          warning<std::__cxx11::string_const&>(this,&Metadata::CustomMetadata,&pKVar19->key);
        }
      }
      else {
        pcVar8 = *(code **)((long)iVar6.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                  ._M_cur + 0x28);
        pkVar15 = (this->header).identifier +
                  *(long *)((long)iVar6.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                  ._M_cur + 0x30) + -0x38;
        if (((ulong)pcVar8 & 1) != 0) {
          pcVar8 = *(code **)(pcVar8 + *(long *)pkVar15 + -1);
        }
        (*pcVar8)(pkVar15,pKVar19->data,pKVar19->size);
      }
    }
    if ((this->foundKTXanimData != false) && (this->foundKTXcubemapIncomplete == true)) {
      error<>(this,&Metadata::KTXanimDataWithCubeIncomplete);
    }
    if (this->foundKTXwriter == false) {
      if (this->foundKTXwriterScParams == true) {
        error<>(this,&Metadata::KTXwriterRequiredButMissing);
      }
      else {
        warning<>(this,&Metadata::KTXwriterMissing);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&kvValidators._M_h);
    std::
    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&keys._M_h);
    std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::~vector(&entries);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buffer);
  }
  return;
}

Assistant:

void ValidationContext::validateKVD() {
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;

    if (kvdByteOffset == 0 || kvdByteLength == 0)
        return; // There is no KVD block

    const auto buffer = std::make_unique<uint8_t[]>(kvdByteLength);
    read(kvdByteOffset, buffer.get(), kvdByteLength, "the Key/Value Data");
    const auto* ptrKVD = buffer.get();
    const auto* ptrKVDEnd = ptrKVD + kvdByteLength;

    struct KeyValueEntry {
        std::string key;
        const uint8_t* data;
        uint32_t size;

        KeyValueEntry(std::string_view key, const uint8_t* data, uint32_t size) :
                key(key), data(data), size(size) {}
    };
    std::vector<KeyValueEntry> entries;
    std::unordered_set<std::string_view> keys;

    uint32_t numKVEntry = 0;
    // Process Key-Value entries {size, key, \0, value} until the end of the KVD block
    // Where size is an uint32_t, and it equals to: sizeof(key) + 1 + sizeof(value)
    const auto* ptrEntry = ptrKVD;
    while (ptrEntry < ptrKVDEnd) {
        const auto remainingKVDBytes = ptrKVDEnd - ptrEntry;

        if (++numKVEntry > MAX_NUM_KV_ENTRIES) {
            warning(Metadata::TooManyEntries, numKVEntry - 1, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        if (remainingKVDBytes < 6) {
            error(Metadata::NotEnoughDataForAnEntry, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        uint32_t sizeKeyValuePair;
        std::memcpy(&sizeKeyValuePair, ptrEntry, sizeof(uint32_t));

        const auto* ptrKeyValuePair = ptrEntry + sizeof(uint32_t);
        const auto* ptrKey = ptrKeyValuePair;

        if (sizeKeyValuePair < 2) {
            error(Metadata::KeyAndValueByteLengthTooSmall, sizeKeyValuePair);
        } else {
            if (ptrKeyValuePair + sizeKeyValuePair > ptrKVDEnd) {
                const auto bytesLeft = ptrKVDEnd - ptrKeyValuePair;
                error(Metadata::KeyAndValueByteLengthTooLarge, sizeKeyValuePair, bytesLeft);
                sizeKeyValuePair = static_cast<uint32_t>(bytesLeft); // Attempt recovery to read out at least the key
            }

            // Determine key, finding the null terminator
            uint32_t sizeKey = 0;
            while (sizeKey < sizeKeyValuePair && ptrKey[sizeKey] != '\0')
                ++sizeKey;

            if (sizeKey == 0) {
                error(Metadata::KeyEmpty);
            } else {
                const auto keyHasNullTerminator = sizeKey != sizeKeyValuePair;
                auto key = std::string_view(reinterpret_cast<const char*>(ptrKey), sizeKey);

                // Determine the value
                const auto* ptrValue = ptrKey + sizeKey + 1;
                const auto sizeValue = keyHasNullTerminator ? sizeKeyValuePair - sizeKey - 1 : 0;

                // Check for BOM
                if (starts_with(key, "\xEF\xBB\xBF")) {
                    key.remove_prefix(3);
                    error(Metadata::KeyForbiddenBOM, key);
                }

                if (auto invalidIndex = validateUTF8(key))
                    error(Metadata::KeyInvalidUTF8, key, *invalidIndex);

                if (!keyHasNullTerminator)
                    error(Metadata::KeyMissingNullTerminator, key);

                entries.emplace_back(key, ptrValue, sizeValue);

                if (!keys.emplace(key).second)
                    error(Metadata::DuplicateKey, key);
            }
        }

        // Finish entry
        ptrEntry += sizeof(uint32_t) + sizeKeyValuePair;
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 4, Metadata::PaddingNotZero, "after a Key-Value entry");
        ptrEntry = align(ptrEntry, 4);
    }

    if (ptrEntry != ptrKVDEnd)
        // Being super explicit about the specs. This check might be overkill as other checks often cover this case
        error(Metadata::SizesDontAddUp, ptrEntry - ptrKVD, kvdByteLength);

    if (header.supercompressionGlobalData.byteLength != 0)
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 8, Metadata::PaddingNotZero, "after the last KVD entry");

    if (!is_sorted(entries, std::less<>{}, &KeyValueEntry::key)) {
        error(Metadata::OutOfOrder);
        sort(entries, std::less<>{}, &KeyValueEntry::key);
    }

    using MemberFN = void(ValidationContext::*)(const uint8_t*, uint32_t);
    std::unordered_map<std::string, MemberFN> kvValidators;

    kvValidators.emplace("KTXcubemapIncomplete", &ValidationContext::validateKTXcubemapIncomplete);
    kvValidators.emplace("KTXorientation", &ValidationContext::validateKTXorientation);
    kvValidators.emplace("KTXglFormat", &ValidationContext::validateKTXglFormat);
    kvValidators.emplace("KTXdxgiFormat__", &ValidationContext::validateKTXdxgiFormat);
    kvValidators.emplace("KTXmetalPixelFormat", &ValidationContext::validateKTXmetalPixelFormat);
    kvValidators.emplace("KTXswizzle", &ValidationContext::validateKTXswizzle);
    kvValidators.emplace("KTXwriter", &ValidationContext::validateKTXwriter);
    kvValidators.emplace("KTXwriterScParams", &ValidationContext::validateKTXwriterScParams);
    kvValidators.emplace("KTXastcDecodeMode", &ValidationContext::validateKTXastcDecodeMode);
    kvValidators.emplace("KTXanimData", &ValidationContext::validateKTXanimData);

    for (const auto& entry : entries) {
        const auto it = kvValidators.find(entry.key);
        if (it != kvValidators.end()) {
            (this->*it->second)(entry.data, entry.size);
        } else {
            if (starts_with(entry.key, "KTX") || starts_with(entry.key, "ktx"))
                error(Metadata::UnknownReservedKey, entry.key);
            else
                warning(Metadata::CustomMetadata, entry.key);
        }
    }

    if (foundKTXanimData && foundKTXcubemapIncomplete)
        error(Metadata::KTXanimDataWithCubeIncomplete);

    if (!foundKTXwriter) {
        if (foundKTXwriterScParams)
            error(Metadata::KTXwriterRequiredButMissing);
        else
            warning(Metadata::KTXwriterMissing);
    }
}